

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O2

int has_non_ASCII(char *_p)

{
  char cVar1;
  
  if (_p != (char *)0x0) {
    do {
      cVar1 = *_p;
      _p = _p + 1;
    } while ('\0' < cVar1);
    return (int)(cVar1 != '\0');
  }
  return 1;
}

Assistant:

static int
has_non_ASCII(const char *_p)
{
	const unsigned char *p = (const unsigned char *)_p;

	if (p == NULL)
		return (1);
	while (*p != '\0' && *p < 128)
		p++;
	return (*p != '\0');
}